

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O0

void test_hrr(void)

{
  int iVar1;
  ptls_t *tls;
  ptls_t *tls_00;
  size_t sStack_c170;
  int ret;
  size_t consumed;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  undefined1 local_160 [8];
  ptls_buffer_t decbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  ptls_t *server;
  ptls_t *client;
  ptls_context_t client_ctx;
  ptls_key_exchange_algorithm_t *client_keyex [3];
  
  client_ctx.private_key_method = (ptls_private_key_method_t *)&ptls_minicrypto_x25519;
  memset(&client,0,200);
  client = (ptls_t *)ptls_minicrypto_random_bytes;
  client_ctx.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
  client_ctx.get_time = (ptls_get_time_t *)&client_ctx.private_key_method;
  client_ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_minicrypto_cipher_suites;
  if ((*ctx_peer->key_exchanges != (ptls_key_exchange_algorithm_t *)0x0) &&
     ((*ctx_peer->key_exchanges)->id == 0x17)) {
    if (ctx_peer->key_exchanges[1] != (ptls_key_exchange_algorithm_t *)0x0) {
      __assert_fail("ctx_peer->key_exchanges[1] == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c"
                    ,0x4d,"void test_hrr(void)");
    }
    tls = ptls_new((ptls_context_t *)&client,0);
    tls_00 = ptls_new(ctx_peer,1);
    ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,sbuf_small + 0x3ff8,0x4000);
    ptls_buffer_init((ptls_buffer_t *)&decbuf.is_allocated,decbuf_small + 0x3ff8,0x4000);
    ptls_buffer_init((ptls_buffer_t *)local_160,&consumed,0x4000);
    iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                           (ptls_handshake_properties_t *)0x0);
    _ok((uint)(iVar1 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x56);
    sStack_c170 = cbuf.capacity;
    iVar1 = ptls_handshake(tls_00,(ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                           &stack0xffffffffffff3e90,(ptls_handshake_properties_t *)0x0);
    _ok((uint)(iVar1 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5a);
    _ok((uint)(sStack_c170 == cbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5b);
    _ok((uint)(9 < sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5e);
    _ok((uint)(*(char *)(decbuf._24_8_ + 5) == '\x02'),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x5f);
    sStack_c170 = sbuf.capacity;
    iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                           &stack0xffffffffffff3e90,(ptls_handshake_properties_t *)0x0);
    _ok((uint)(iVar1 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",99);
    _ok((uint)(sStack_c170 == sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",100);
    sbuf.capacity = 0;
    _ok(0,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x67);
    _ok((uint)(*(char *)(sbuf._24_8_ + 5) == '\x01'),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x68);
    sStack_c170 = 0;
    while (iVar1 = ptls_handshake(tls_00,(ptls_buffer_t *)&decbuf.is_allocated,(void *)sbuf._24_8_,
                                  &stack0xffffffffffff3e90,(ptls_handshake_properties_t *)0x0),
          iVar1 == 0x202) {
      usleep(100);
    }
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x72);
    _ok((uint)(sStack_c170 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x73);
    _ok((uint)(8 < sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x76);
    _ok((uint)(*(char *)(decbuf._24_8_ + 5) == '\x02'),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x77);
    sStack_c170 = sbuf.capacity;
    iVar1 = ptls_handshake(tls,(ptls_buffer_t *)&sbuf.is_allocated,(void *)decbuf._24_8_,
                           &stack0xffffffffffff3e90,(ptls_handshake_properties_t *)0x0);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x7b);
    _ok((uint)(sStack_c170 == sbuf.capacity),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x7c);
    sbuf.capacity = 0;
    iVar1 = ptls_send(tls,(ptls_buffer_t *)&sbuf.is_allocated,"hello world",0xb);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x80);
    sStack_c170 = 0;
    iVar1 = ptls_receive(tls_00,(ptls_buffer_t *)local_160,(void *)sbuf._24_8_,
                         &stack0xffffffffffff3e90);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x84);
    _ok((uint)(sStack_c170 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x85);
    _ok((uint)(decbuf.capacity == 0xb),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x88);
    iVar1 = memcmp((void *)local_160,"hello world",0xb);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c",0x89);
    ptls_buffer_dispose((ptls_buffer_t *)local_160);
    ptls_buffer_dispose((ptls_buffer_t *)&decbuf.is_allocated);
    ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
    ptls_free(tls);
    ptls_free(tls_00);
    return;
  }
  __assert_fail("ctx_peer->key_exchanges[0] != NULL && ctx_peer->key_exchanges[0]->id == PTLS_GROUP_SECP256R1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/minicrypto.c"
                ,0x4c,"void test_hrr(void)");
}

Assistant:

static void test_hrr(void)
{
    ptls_key_exchange_algorithm_t *client_keyex[] = {&ptls_minicrypto_x25519, &ptls_minicrypto_secp256r1, NULL};
    ptls_context_t client_ctx = {ptls_minicrypto_random_bytes, &ptls_get_time, client_keyex, ptls_minicrypto_cipher_suites};
    ptls_t *client, *server;
    ptls_buffer_t cbuf, sbuf, decbuf;
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    size_t consumed;
    int ret;

    assert(ctx_peer->key_exchanges[0] != NULL && ctx_peer->key_exchanges[0]->id == PTLS_GROUP_SECP256R1);
    assert(ctx_peer->key_exchanges[1] == NULL);

    client = ptls_new(&client_ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    ret = ptls_handshake(client, &cbuf, NULL, NULL, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(sbuf.off > 5 + 4);
    ok(sbuf.base[5] == 2 /* PTLS_HANDSHAKE_TYPE_SERVER_HELLO (RETRY_REQUEST) */);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(consumed == sbuf.off);
    sbuf.off = 0;

    ok(cbuf.off >= 5 + 4);
    ok(cbuf.base[5] == 1 /* PTLS_HANDSHAKE_TYPE_CLIENT_HELLO */);

    consumed = cbuf.off;
    do
    {
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
        if (ret == PTLS_ERROR_IN_PROGRESS)
            usleep(100);
    }
    while (ret == PTLS_ERROR_IN_PROGRESS);
    ok(ret == 0);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(sbuf.off >= 5 + 4);
    ok(sbuf.base[5] == 2 /* PTLS_HANDSHAKE_TYPE_SERVER_HELLO */);

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    sbuf.off = 0;

    ret = ptls_send(client, &cbuf, "hello world", 11);
    ok(ret == 0);

    consumed = cbuf.off;
    ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == cbuf.off);
    cbuf.off = 0;

    ok(decbuf.off == 11);
    ok(memcmp(decbuf.base, "hello world", 11) == 0);

    ptls_buffer_dispose(&decbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&cbuf);
    ptls_free(client);
    ptls_free(server);
}